

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

Ptr __thiscall core::image::raw_to_float_image(image *this,ConstPtr *image)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int chans;
  invalid_argument *this_00;
  TypedImageBase<float> *this_01;
  ImageBase *pIVar5;
  TypedImageBase<unsigned_short> *this_02;
  element_type *this_03;
  unsigned_short *puVar6;
  float *pfVar7;
  element_type *this_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar8;
  float local_38;
  float local_34;
  float local_30;
  int local_2c;
  float value;
  int i;
  ConstPtr *local_18;
  ConstPtr *image_local;
  Ptr *img;
  
  local_18 = image;
  image_local = (ConstPtr *)this;
  bVar2 = std::operator==(image,(nullptr_t)0x0);
  if (bVar2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  value._3_1_ = 0;
  Image<float>::create();
  this_01 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<float>;
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar4 = ImageBase::height(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  chans = ImageBase::channels(pIVar5);
  TypedImageBase<float>::allocate(this_01,iVar3,iVar4,chans);
  local_2c = 0;
  while( true ) {
    iVar3 = local_2c;
    this_02 = &std::
               __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<unsigned_short>;
    iVar4 = TypedImageBase<unsigned_short>::get_value_amount(this_02);
    if (iVar4 <= iVar3) break;
    this_03 = std::
              __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    puVar6 = Image<unsigned_short>::at(this_03,local_2c);
    local_30 = (float)*puVar6 / 65535.0;
    local_34 = 1.0;
    local_38 = 0.0;
    pfVar7 = std::max<float>(&local_38,&local_30);
    pfVar7 = std::min<float>(&local_34,pfVar7);
    fVar1 = *pfVar7;
    this_04 = std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    pfVar7 = Image<float>::at(this_04,local_2c);
    *pfVar7 = fVar1;
    local_2c = local_2c + 1;
  }
  PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FloatImage::Ptr
raw_to_float_image (RawImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    FloatImage::Ptr img = FloatImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        float const value = static_cast<float>(image->at(i)) / 65535.0f;
        img->at(i) = std::min(1.0f, std::max(0.0f, value));
    }
    return img;
}